

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

void gdImageGifAnimBeginCtx(gdImagePtr im,gdIOCtxPtr out,int GlobalCM,int Loops)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  sbyte sVar5;
  
  uVar1 = im->colorsTotal;
  sVar5 = 1;
  if ((((2 < (int)uVar1) && (sVar5 = 2, 4 < uVar1)) && (sVar5 = 3, 8 < uVar1)) &&
     (((sVar5 = 4, 0x10 < uVar1 && (sVar5 = 5, 0x20 < uVar1)) &&
      ((sVar5 = 6, 0x40 < uVar1 && (sVar5 = 7, 0x80 < uVar1)))))) {
    sVar5 = (uVar1 < 0x101) << 3;
  }
  iVar2 = im->sx;
  iVar3 = im->sy;
  gdPutBuf("GIF89a",6,out);
  gdPutC((uchar)iVar2,out);
  gdPutC((uchar)((uint)iVar2 >> 8),out);
  gdPutC((uchar)iVar3,out);
  gdPutC((uchar)((uint)iVar3 >> 8),out);
  gdPutC((sVar5 - 1U) * '\x10' | sVar5 - 1U | (GlobalCM != 0) << 7,out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  if (GlobalCM != 0) {
    lVar4 = 0x205;
    do {
      gdPutC(*(uchar *)((long)im + lVar4 * 4 + -0x800),out);
      gdPutC(*(uchar *)((long)im + lVar4 * 4 + -0x400),out);
      gdPutC((uchar)im->red[lVar4 + -5],out);
      iVar2 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (iVar2 - 0x204U >> sVar5 == 0);
  }
  if (-1 < Loops) {
    gdPutBuf(anon_var_dwarf_e649,0x10,out);
    gdPutC((uchar)Loops,out);
    gdPutC((uchar)((uint)Loops >> 8),out);
    gdPutC('\0',out);
    return;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimBeginCtx(gdImagePtr im, gdIOCtxPtr out, int GlobalCM, int Loops)
{
	int B;
	int RWidth, RHeight;
	int Resolution;
	int ColorMapSize;
	int BitsPerPixel;
	int Background = 0;
	int i;

	/* Default is to use global color map */
	if (GlobalCM < 0) {
		GlobalCM = 1;
	}

	BitsPerPixel = colorstobpp(im->colorsTotal);
	ColorMapSize = 1 << BitsPerPixel;

	RWidth = im->sx;
	RHeight = im->sy;

	Resolution = BitsPerPixel;

	/* Write the Magic header */
	gdPutBuf("GIF89a", 6, out);

	/* Write out the screen width and height */
	gifPutWord(RWidth, out);
	gifPutWord(RHeight, out);

	/* Indicate that there is a global colour map */
	B = GlobalCM ? 0x80 : 0;

	/* OR in the resolution */
	B |= (Resolution - 1) << 4;

	/* OR in the Bits per Pixel */
	B |= (BitsPerPixel - 1);

	/* Write it out */
	gdPutC(B, out);

	/* Write out the Background colour */
	gdPutC(Background, out);

	/* Byte of 0's (future expansion) */
	gdPutC(0, out);

	/* Write out the Global Colour Map */
	if(GlobalCM) {
		for(i = 0; i < ColorMapSize; ++i) {
			gdPutC(im->red[i], out);
			gdPutC(im->green[i], out);
			gdPutC(im->blue[i], out);
		}
	}

	if(Loops >= 0) {
		gdPutBuf("!\377\13NETSCAPE2.0\3\1", 16, out);
		gifPutWord(Loops, out);
		gdPutC(0, out);
	}
}